

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doShowAttachment(QPDFJob *this,QPDF *pdf)

{
  runtime_error *this_00;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  shared_ptr<QPDFFileSpecObjectHelper> fs;
  QPDFObjectHandle efs;
  QPDFEmbeddedFileDocumentHelper efdh;
  
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(&efdh,pdf);
  QPDFEmbeddedFileDocumentHelper::getEmbeddedFile
            ((QPDFEmbeddedFileDocumentHelper *)&fs,(string *)&efdh);
  if (fs.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
    QPDFFileSpecObjectHelper::getEmbeddedFileStream
              ((QPDFFileSpecObjectHelper *)&efs,
               (string *)
               fs.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::~string((string *)&local_88);
    QPDFLogger::saveToStandardOutput
              ((((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
    QPDFLogger::getSave((QPDFLogger *)&local_88,
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    QPDFObjectHandle::pipeStreamData
              (&efs,(Pipeline *)local_88._M_dataplus._M_p,0,qpdf_dl_all,false,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&efs.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fs.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper(&efdh);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&efs,
                 "attachment ",
                 &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->attachment_to_show);
  std::operator+(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&efs
                 ," not found");
  std::runtime_error::runtime_error(this_00,(string *)&local_88);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFJob::doShowAttachment(QPDF& pdf)
{
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    auto fs = efdh.getEmbeddedFile(m->attachment_to_show);
    if (!fs) {
        throw std::runtime_error("attachment " + m->attachment_to_show + " not found");
    }
    auto efs = fs->getEmbeddedFileStream();
    // saveToStandardOutput has already been called, but it's harmless to call it again, so do as
    // defensive coding.
    m->log->saveToStandardOutput(true);
    efs.pipeStreamData(m->log->getSave().get(), 0, qpdf_dl_all);
}